

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O1

bool __thiscall PSEngine::undo(PSEngine *this)

{
  pointer pLVar1;
  pointer pLVar2;
  pointer pLVar3;
  int iVar4;
  long *local_70;
  long local_68;
  long local_60 [2];
  undefined1 local_50 [16];
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  local_50._0_4_ = Undo;
  local_50._4_4_ = None;
  local_50._8_4_ = -1;
  local_50._12_4_ = -1.0;
  local_40._M_p = (pointer)&local_30;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,local_70,local_68 + (long)local_70);
  std::vector<PSEngine::Operation,_std::allocator<PSEngine::Operation>_>::
  emplace_back<PSEngine::Operation>(&this->m_operation_history,(Operation *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  pLVar1 = (this->m_level_state_stack).
           super__Vector_base<PSEngine::Level,_std::allocator<PSEngine::Level>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar2 = (this->m_level_state_stack).
           super__Vector_base<PSEngine::Level,_std::allocator<PSEngine::Level>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pLVar2 != pLVar1) {
    (this->m_current_level).size.y = pLVar2[-1].size.y;
    iVar4 = pLVar2[-1].size.x;
    (this->m_current_level).level_idx = pLVar2[-1].level_idx;
    (this->m_current_level).size.x = iVar4;
    std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::operator=
              (&(this->m_current_level).cells,&pLVar2[-1].cells);
    pLVar3 = (this->m_level_state_stack).
             super__Vector_base<PSEngine::Level,_std::allocator<PSEngine::Level>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (this->m_level_state_stack).
    super__Vector_base<PSEngine::Level,_std::allocator<PSEngine::Level>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar3 + -1;
    std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::~vector(&pLVar3[-1].cells);
  }
  return pLVar2 != pLVar1;
}

Assistant:

bool PSEngine::undo()
{
    m_operation_history.push_back(Operation(OperationType::Undo));

    if(m_level_state_stack.size() == 0)
    {
        return false;
    }

    m_current_level = m_level_state_stack.back();
    m_level_state_stack.pop_back();

    return true; //todo ? shouln't we return deltas for undos ?
}